

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_qualities.cpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::filter_coarsen_min_qual
          (Omega_h *this,Read<signed_char> *cand_codes,Reals *cand_quals,Real min_qual)

{
  void *extraout_RDX;
  Read<signed_char> RVar1;
  Bytes keep_dirs;
  Write<signed_char> local_58;
  Write<signed_char> local_48;
  Write<signed_char> local_38;
  Write<double> local_28;
  
  Write<double>::Write(&local_28,&cand_quals->write_);
  each_geq_to<double>((Omega_h *)&local_38,(Read<double> *)&local_28,min_qual);
  Write<double>::~Write(&local_28);
  Write<signed_char>::Write(&local_48,&cand_codes->write_);
  Write<signed_char>::Write(&local_58,&local_38);
  filter_coarsen_dirs(this,(Read<signed_char> *)&local_48,(Read<signed_char> *)&local_58);
  Write<signed_char>::~Write(&local_58);
  Write<signed_char>::~Write(&local_48);
  Write<signed_char>::~Write(&local_38);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<I8> filter_coarsen_min_qual(
    Read<I8> cand_codes, Reals cand_quals, Real min_qual) {
  auto keep_dirs = each_geq_to(cand_quals, min_qual);
  return filter_coarsen_dirs(cand_codes, keep_dirs);
}